

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O3

void __thiscall CGV::visit(CGV *this,Write *node)

{
  CodeWriter *pCVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  string *__rhs;
  _Elt_pointer ppAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  _Map_pointer local_70;
  _Elt_pointer local_68;
  string local_60;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_40 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 != local_40) {
    local_68 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_last;
    local_70 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      (**(*ppAVar3)->_vptr_ASTNode)(*ppAVar3,this);
      pCVar1 = this->writer;
      __rhs = Variable::getName_abi_cxx11_(this->currentVar);
      std::operator+(&local_b0,"Writing variable ",__rhs);
      CodeWriter::comment(pCVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pCVar1 = this->writer;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"r1","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"r12","");
      CodeWriter::loadWord(pCVar1,&local_b0,-4,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_38 = ppAVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pCVar1 = this->writer;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"jl","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"r15","");
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"putint","");
      CodeWriter::OP(pCVar1,&local_b0,&local_90,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pCVar1 = this->writer;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Printing new line","");
      ppAVar3 = local_38;
      CodeWriter::comment(pCVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      CodeWriter::endl(this->writer);
      ppAVar3 = ppAVar3 + 1;
      if (ppAVar3 == local_68) {
        ppAVar3 = local_70[1];
        local_70 = local_70 + 1;
        local_68 = ppAVar3 + 0x40;
      }
    } while (ppAVar3 != local_40);
  }
  return;
}

Assistant:

void CGV::visit(Write *node) {
    for (auto &child : node->getChildren()) {
        child->accept(*this);
        writer->comment("Writing variable " + currentVar->getName());
        writer->loadWord("r1", -4, "r12");
        writer->OP("jl", "r15", "putint");
        writer->comment("Printing new line");
        writer->endl();
    }
}